

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

int Catch::Main(Config *configWrapper)

{
  bool bVar1;
  exception *ex;
  int local_2a0;
  uint local_284;
  ConfigData *local_280;
  ConfigData *config;
  undefined1 local_268 [8];
  Runner2 runner;
  int result;
  Config *configWrapper_local;
  
  runner.m_testsAlreadyRun._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  Runner2::Runner2((Runner2 *)local_268,configWrapper);
  local_280 = Config::data(configWrapper);
  bVar1 = local_280->listSpec == None;
  if (bVar1) {
    Runner2::runTests((Totals *)&ex,(Runner2 *)local_268);
    runner.m_testsAlreadyRun._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = local_2a0;
  }
  else {
    List(local_280);
    cleanUp();
    configWrapper_local._4_4_ = 0;
  }
  local_284 = (uint)!bVar1;
  Runner2::~Runner2((Runner2 *)local_268);
  if (local_284 == 0) {
    cleanUp();
    configWrapper_local._4_4_ =
         runner.m_testsAlreadyRun._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
  }
  return configWrapper_local._4_4_;
}

Assistant:

inline int Main( Config& configWrapper ) {
        int result = 0;
        try
        {
            Runner2 runner( configWrapper );

            const ConfigData& config = configWrapper.data();

            // Handle list request
            if( config.listSpec != List::None ) {
                List( config );
                Catch::cleanUp();
                return 0;
            }

            result = static_cast<int>( runner.runTests().assertions.failed );

        }
        catch( std::exception& ex ) {
            std::cerr << ex.what() << std::endl;
            result = (std::numeric_limits<int>::max)();
        }

        Catch::cleanUp();
        return result;
    }